

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O1

void __thiscall
libtest::printer::cprintf<char_const*,char_const*,char_const*>
          (printer *this,ansi_sgr *command,char *args,char *args_1,char *args_2)

{
  ostream *poVar1;
  allocator<char> local_99;
  string local_98;
  string local_78;
  string local_58;
  ansi_sgr local_38;
  
  poVar1 = this->os;
  ansi_sgr::to_string_abi_cxx11_(&local_58,command);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,args,&local_99);
  local_98._M_dataplus._M_p = args_1;
  format_rec<char_const*,char_const*>(this,&local_78,0,(char **)&local_98,args_2);
  poVar1 = this->os;
  local_38.m_color = white;
  local_38.m_attr = reset;
  ansi_sgr::to_string_abi_cxx11_(&local_98,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_98._M_dataplus._M_p,local_98._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cprintf(const ansi_sgr& command, Args... args) { os << command.to_string(), printf(args...), os << ansi_sgr{}.to_string(); }